

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysdep-unix.c
# Opt level: O0

void write_version_file(global_state_t *g,int n)

{
  FILE *pFVar1;
  int iVar2;
  tm *__tp;
  char *pcVar3;
  ulong uVar4;
  uint in_ESI;
  int err;
  utsname sys_info;
  FILE *fp;
  time_t t;
  char buf [256];
  char *env;
  char *local_2f8;
  char *local_2e8;
  char *local_2d8;
  utsname local_2ae;
  FILE *local_128;
  time_t local_120;
  char local_118 [256];
  char *local_18;
  uint local_c;
  
  local_c = in_ESI;
  local_18 = getenv("CILK_VERSION");
  if (local_18 != (char *)0x0) {
    iVar2 = strcasecmp(local_18,"stderr");
    if (iVar2 == 0) {
      local_128 = _stderr;
    }
    else {
      iVar2 = strcasecmp(local_18,"stdout");
      if (iVar2 == 0) {
        local_128 = _stdout;
      }
      else {
        local_128 = fopen(local_18,"w");
        if (local_128 == (FILE *)0x0) {
          return;
        }
      }
    }
    local_120 = time((time_t *)0x0);
    __tp = localtime(&local_120);
    strftime(local_118,0x100,"%a %b %d %H:%M:%S %Y",__tp);
    fprintf(local_128,"Cilk runtime initialized: %s\n",local_118);
    fprintf(local_128,"\nCilk runtime information\n");
    fprintf(local_128,"========================\n");
    fprintf(local_128,"Cilk version: %d.%d.%d Build %d\n",2,0,0,0x11a4);
    fprintf(local_128,"Compiled with GCC V%d.%d.%d\n",4,2,1);
    fprintf(local_128,"\nSystem information\n");
    fprintf(local_128,"==================\n");
    pFVar1 = local_128;
    pcVar3 = get_runtime_path();
    fprintf(pFVar1,"Cilk runtime path: %s\n",pcVar3);
    iVar2 = uname(&local_2ae);
    if (iVar2 < 0) {
      local_2d8 = "unknown";
      local_2e8 = "?";
    }
    else {
      local_2d8 = local_2ae.sysname;
      local_2e8 = local_2ae.release;
    }
    fprintf(local_128,"System OS: %s, release %s\n",local_2d8,local_2e8);
    if (iVar2 < 0) {
      local_2f8 = "unknown";
    }
    else {
      local_2f8 = local_2ae.machine;
    }
    fprintf(local_128,"System architecture: %s\n",local_2f8);
    fprintf(local_128,"\nThread information\n");
    fprintf(local_128,"==================\n");
    pFVar1 = local_128;
    uVar4 = sysconf(0x54);
    fprintf(pFVar1,"System cores: %d\n",uVar4 & 0xffffffff);
    fprintf(local_128,"Cilk workers requested: %d\n",(ulong)local_c);
    if ((local_128 == _stderr) || (local_128 == _stdout)) {
      fflush(local_128);
    }
    else {
      fclose(local_128);
    }
  }
  return;
}

Assistant:

static void write_version_file (global_state_t *g, int n)
{
    const char *env;      // environment variable.
    char buf[256];        // print buffer.
    time_t t;
    FILE *fp;
#ifndef _WRS_KERNEL
    struct utsname sys_info;
#endif
    int err;              // error code from system calls.

    // if CILK_VERSION is not set, or if the file cannot be opened, fail
    // silently.  Otherwise open the file for writing (or use stderr or stdout
    // if the user specifies).
    if (NULL == (env = getenv("CILK_VERSION"))) return;
    if (0 == strcasecmp(env, "stderr"))         fp = stderr;
    else if (0 == strcasecmp(env, "stdout"))    fp = stdout;
    else if (NULL == (fp = fopen(env, "w")))    return;

    // get a string for the current time.  E.g.,
    // Cilk runtime initialized: Thu Jun 10 13:28:00 2010
    t = time(NULL);
    strftime(buf, 256, "%a %b %d %H:%M:%S %Y", localtime(&t));
    fprintf(fp, "Cilk runtime initialized: %s\n", buf);

    // Print runtime info.  E.g.,
    // Cilk runtime information
    // ========================
    // Cilk version: 2.0.0 Build 9184
    // Built by willtor on host willtor-desktop
    // Compilation date: Thu Jun 10 13:27:42 2010
    // Compiled with ICC V99.9.9, ICC build date: 20100610

    fprintf(fp, "\nCilk runtime information\n");
    fprintf(fp, "========================\n");
    fprintf(fp, "Cilk version: %d.%d.%d Build %d\n",
            VERSION_MAJOR,
            VERSION_MINOR,
            VERSION_REV,
            VERSION_BUILD);
#ifdef __VXWORKS__    
    char * vxWorksVer = VXWORKS_VERSION; 
    fprintf(fp, "Cross compiled for %s\n",vxWorksVer);
    // user and host not avalible if VxWorks cross compiled on windows build host 
#else

    // User and host are not available for GCC builds
#ifdef BUILD_USER
    fprintf(fp, "Built by "BUILD_USER" on host "BUILD_HOST"\n");
#endif // BUILD_USER
#endif // __VXWORKS__

    // GCC has requested that this be removed for GCC builds
#ifdef BUILD_USER    
    fprintf(fp, "Compilation date: "__DATE__" "__TIME__"\n");
#endif // BUILD_USER

#ifdef __INTEL_COMPILER
    // Compiled by the Intel C/C++ compiler.
    fprintf(fp, "Compiled with ICC V%d.%d.%d, ICC build date: %d\n",
            __INTEL_COMPILER / 100,
            (__INTEL_COMPILER / 10) % 10,
            __INTEL_COMPILER % 10,
            __INTEL_COMPILER_BUILD_DATE);
#else
    // Compiled by GCC.
    fprintf(fp, "Compiled with GCC V%d.%d.%d\n",
            __GNUC__,
            __GNUC_MINOR__,
            __GNUC_PATCHLEVEL__);
#endif // defined __INTEL_COMPILER

    // Print system info.  E.g.,
    // System information
    // ==================
    // Cilk runtime path: /opt/icc/64/lib/libcilkrts.so.5
    // System OS: Linux, release 2.6.28-19-generic
    // System architecture: x86_64

    fprintf(fp, "\nSystem information\n");
    fprintf(fp, "==================\n");
    fprintf(fp, "Cilk runtime path: %s\n", get_runtime_path());
#ifndef _WRS_KERNEL
    err = uname(&sys_info);
    fprintf(fp, "System OS: %s, release %s\n",
            err < 0 ? "unknown" : sys_info.sysname,
            err < 0 ? "?" : sys_info.release);
    fprintf(fp, "System architecture: %s\n",
            err < 0 ? "unknown" : sys_info.machine);
#else
    fprintf(fp, "System OS: %s, release %s\n",
            "VxWorks", RUNTIME_NAME RUNTIME_VERSION);
    fprintf(fp, "System architecture: %s\n",
            sysModel());
#endif

    // Print thread info.  E.g.,
    // Thread information
    // ==================
    // System cores: 8
    // Cilk workers requested: 8

    fprintf(fp, "\nThread information\n");
    fprintf(fp, "==================\n");
#ifdef __VXWORKS__      
    fprintf(fp, "System cores: %d\n", (int)__builtin_popcount(vxCpuEnabledGet()));
#else    
    fprintf(fp, "System cores: %d\n", (int)sysconf(_SC_NPROCESSORS_ONLN));
#endif    
    fprintf(fp, "Cilk workers requested: %d\n", n);

    if (fp != stderr && fp != stdout) fclose(fp);
    else fflush(fp); // flush the handle buffer if it is stdout or stderr.
}